

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head)

{
  cmLocalGenerator *lg;
  bool bVar1;
  __type _Var2;
  PolicyStatus PVar3;
  cmTargetLinkLibraryType cVar4;
  reference pcVar5;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmCompiledGeneratorExpression *pcVar6;
  char *pcVar7;
  reference pbVar8;
  ostream *poVar9;
  reference pbVar10;
  cmake *pcVar11;
  pointer ppVar12;
  string *psVar13;
  ulong uVar14;
  cmGeneratorTarget *pcVar15;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  cmLinkItem local_4f0;
  undefined1 local_4c8 [8];
  string name_1;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
  local_4a0;
  const_iterator li_1;
  LinkLibraryVectorType *oldllibs;
  undefined1 local_488 [4];
  cmTargetLinkLibraryType linkType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  _Self local_460;
  _Self local_458;
  const_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *seenProps;
  int local_3f4;
  cmListFileBacktrace local_3f0;
  string local_3d0;
  string local_3b0;
  undefined1 local_390 [8];
  ostringstream e;
  MessageType local_218;
  MessageType messageType;
  bool noMessage;
  string name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  const_iterator li;
  string local_1d0;
  undefined1 local_1b0 [8];
  string evaluated;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string local_150;
  undefined1 local_120 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  const_iterator end;
  const_iterator le;
  const_iterator btIt;
  cmBacktraceRange btRange;
  cmStringRange entryRange;
  cmGeneratorTarget *head_local;
  cmOptionalLinkImplementation *impl_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  join_0x00000010_0x00000000_ = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  _btIt = cmTarget::GetLinkImplementationBacktraces(this->Target);
  le._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
       ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                *)&btIt);
  end = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&btRange.End);
  llibs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&btRange.End);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&llibs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      pcVar11 = cmMakefile::GetCMakeInstance(this->Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_488,pcVar11);
      cVar4 = CMP0003_ComputeLinkType
                        (config,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_488);
      li_1._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
            *)cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this->Target);
      local_4a0._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                       *)li_1._M_current);
      while( true ) {
        name_1.field_2._8_8_ =
             std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
             ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
                    *)li_1._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_4a0,
                           (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                            *)((long)&name_1.field_2 + 8));
        if (!bVar1) break;
        ppVar12 = __gnu_cxx::
                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                  ::operator->(&local_4a0);
        if ((ppVar12->second != GENERAL_LibraryType) &&
           (ppVar12 = __gnu_cxx::
                      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                      ::operator->(&local_4a0), ppVar12->second != cVar4)) {
          ppVar12 = __gnu_cxx::
                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
                    ::operator->(&local_4a0);
          CheckCMP0004((string *)local_4c8,this,&ppVar12->first);
          psVar13 = GetName_abi_cxx11_(this);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_4c8,psVar13);
          if ((_Var2) || (uVar14 = std::__cxx11::string::empty(), (uVar14 & 1) != 0)) {
            local_3f4 = 0xe;
          }
          else {
            pcVar15 = FindTargetToLink(this,(string *)local_4c8);
            cmLinkItem::cmLinkItem(&local_4f0,(std_string *)local_4c8,pcVar15);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (&(impl->super_cmLinkImplementation).super_cmLinkImplementationLibraries.
                        WrongConfigLibraries,&local_4f0);
            cmLinkItem::~cmLinkItem(&local_4f0);
            local_3f4 = 0;
          }
          std::__cxx11::string::~string((string *)local_4c8);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>_>
        ::operator++(&local_4a0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_488);
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dagChecker.CheckResult);
    psVar13 = GetName_abi_cxx11_(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_150,"LINK_LIBRARIES",(allocator *)((long)&ge.Backtrace.Cur + 7));
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_120,psVar13,&local_150,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ge.Backtrace.Cur + 7));
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
             ::operator*((__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                          *)&le);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&cge,pcVar5);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&end);
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)((long)&evaluated.field_2 + 8),(string *)&cge);
    r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                  ((auto_ptr *)(evaluated.field_2._M_local_buf + 8));
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffe80,r);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(evaluated.field_2._M_local_buf + 8));
    pcVar6 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffe80);
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_1d0);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar6,lg,config,false,head,(cmGeneratorExpressionDAGChecker *)local_120,
                        &local_1d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1b0,pcVar7,(allocator *)((long)&li._M_current + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&li._M_current + 7));
    std::__cxx11::string::~string((string *)&local_1d0);
    cmSystemTools::ExpandListArgument
              ((string *)local_1b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&dagChecker.CheckResult,false);
    pcVar6 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffe80);
    bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar6);
    if (bVar1) {
      impl->HadHeadSensitiveCondition = true;
    }
    local_1e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dagChecker.CheckResult);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1e0,&local_1e8);
    while( true ) {
      name.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dagChecker.CheckResult);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1e0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&name.field_2 + 8));
      if (!bVar1) break;
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1e0);
      CheckCMP0004((string *)&messageType,this,pbVar8);
      psVar13 = GetName_abi_cxx11_(this);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &messageType,psVar13);
      if ((_Var2) || (uVar14 = std::__cxx11::string::empty(), (uVar14 & 1) != 0)) {
        psVar13 = GetName_abi_cxx11_(this);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&messageType,psVar13);
        if (_Var2) {
          bVar1 = false;
          local_218 = FATAL_ERROR;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_390);
          PVar3 = GetPolicyStatusCMP0038(this);
          if (PVar3 == OLD) {
            bVar1 = true;
          }
          else if (PVar3 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3b0,(cmPolicies *)0x26,id);
            poVar9 = std::operator<<((ostream *)local_390,(string *)&local_3b0);
            std::operator<<(poVar9,"\n");
            std::__cxx11::string::~string((string *)&local_3b0);
            local_218 = AUTHOR_WARNING;
          }
          if (bVar1) {
LAB_0074c688:
            local_3f4 = 0;
          }
          else {
            poVar9 = std::operator<<((ostream *)local_390,"Target \"");
            psVar13 = GetName_abi_cxx11_(this);
            poVar9 = std::operator<<(poVar9,(string *)psVar13);
            std::operator<<(poVar9,"\" links to itself.");
            pcVar11 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
            std::__cxx11::ostringstream::str();
            GetBacktrace(&local_3f0,this);
            cmake::IssueMessage(pcVar11,local_218,&local_3d0,&local_3f0);
            cmListFileBacktrace::~cmListFileBacktrace(&local_3f0);
            std::__cxx11::string::~string((string *)&local_3d0);
            if (local_218 != FATAL_ERROR) goto LAB_0074c688;
            local_3f4 = 1;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_390);
          if (local_3f4 != 0) goto LAB_0074c771;
        }
        local_3f4 = 7;
      }
      else {
        pcVar15 = FindTargetToLink(this,(string *)&messageType);
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                 ::operator*((__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                              *)&le);
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&end);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1b0,pbVar8);
        cmLinkImplItem::cmLinkImplItem
                  ((cmLinkImplItem *)&seenProps,(string *)&messageType,pcVar15,pcVar5,bVar1);
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::push_back
                  ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)impl,
                   (value_type *)&seenProps);
        cmLinkImplItem::~cmLinkImplItem((cmLinkImplItem *)&seenProps);
        local_3f4 = 0;
      }
LAB_0074c771:
      std::__cxx11::string::~string((string *)&messageType);
      if ((local_3f4 != 0) && (local_3f4 != 7)) goto LAB_0074c91b;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1e0);
    }
    pcVar6 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffe80);
    it._M_node = (_Base_ptr)
                 cmCompiledGeneratorExpression::GetSeenTargetProperties_abi_cxx11_(pcVar6);
    local_458._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)it._M_node);
    while( true ) {
      local_460._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(it._M_node);
      bVar1 = std::operator!=(&local_458,&local_460);
      if (!bVar1) break;
      pbVar10 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_458);
      pcVar7 = GetProperty(this,pbVar10);
      if (pcVar7 == (char *)0x0) {
        pbVar10 = std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_458);
        pVar16 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(&this->LinkImplicitNullProperties,pbVar10);
        debugConfigs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar16.first._M_node;
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_458);
    }
    pcVar6 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffe80);
    cmCompiledGeneratorExpression::GetMaxLanguageStandard(pcVar6,this,&this->MaxLanguageStandards);
    local_3f4 = 0;
LAB_0074c91b:
    std::__cxx11::string::~string((string *)local_1b0);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xfffffffffffffe80);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dagChecker.CheckResult);
    if (local_3f4 != 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&end);
    __gnu_cxx::
    __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
    ::operator++((__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                  *)&le);
  } while( true );
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head) const
{
  cmStringRange entryRange = this->Target->GetLinkImplementationEntries();
  cmBacktraceRange btRange = this->Target->GetLinkImplementationBacktraces();
  cmBacktraceRange::const_iterator btIt = btRange.begin();
  // Collect libraries directly linked in this configuration.
  for (cmStringRange::const_iterator le = entryRange.begin(),
                                     end = entryRange.end();
       le != end; ++le, ++btIt) {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
      this->GetName(), "LINK_LIBRARIES", CM_NULLPTR, CM_NULLPTR);
    cmGeneratorExpression ge(*btIt);
    CM_AUTO_PTR<cmCompiledGeneratorExpression> const cge = ge.Parse(*le);
    std::string const evaluated =
      cge->Evaluate(this->LocalGenerator, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }

    for (std::vector<std::string>::const_iterator li = llibs.begin();
         li != llibs.end(); ++li) {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(*li);
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(cmLinkImplItem(
        name, this->FindTargetToLink(name), *btIt, evaluated != *le));
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
         it != seenProps.end(); ++it) {
      if (!this->GetProperty(*it)) {
        this->LinkImplicitNullProperties.insert(*it);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
       li != oldllibs.end(); ++li) {
    if (li->second != GENERAL_LibraryType && li->second != linkType) {
      std::string name = this->CheckCMP0004(li->first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, this->FindTargetToLink(name)));
    }
  }
}